

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilePS.cpp
# Opt level: O3

void __thiscall
chrono::ChFile_ps::DrawGraphXY(ChFile_ps *this,ChArray<> *Yvalues,ChArray<> *Xvalues)

{
  ChStreamOutAscii *this_00;
  uint uVar1;
  double adVar2 [2];
  uint uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ChVector2<double> local_78;
  ChVector2<double> local_68;
  ChVector2<double> local_58;
  ChVector2<double> local_48;
  
  this_00 = &(this->super_ChStreamOutAsciiFile).super_ChStreamOutAscii;
  ChStreamOutAscii::operator<<(this_00,"GS\n");
  local_48.m_data[0] = (this->G_p).m_data[0];
  local_48.m_data[1] = (this->G_p).m_data[1];
  local_58.m_data[0] = (this->Gs_p).m_data[0];
  local_58.m_data[1] = (this->Gs_p).m_data[1];
  ClipRectangle(this,&local_48,&local_58,PAGE);
  uVar3 = (uint)(Xvalues->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows;
  uVar1 = (uint)(Yvalues->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows;
  if ((int)uVar1 < (int)uVar3) {
    uVar3 = uVar1;
  }
  if (uVar3 != 0) {
    ChStreamOutAscii::operator<<(this_00,"NP\n");
    if (0 < (int)uVar3) {
      uVar4 = 0;
      do {
        if (((Xvalues->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows <= (long)uVar4) ||
           ((Yvalues->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_rows <= (long)uVar4)) {
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Array<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Array<double, -1, 1>, Level = 0]"
                       );
        }
        auVar6._0_8_ = (this->Gs_p).m_data[0] * 0.5 + (this->G_p).m_data[0];
        auVar6._8_8_ = (this->Gs_p).m_data[1] * 0.5 + (this->G_p).m_data[1];
        auVar5._8_8_ = 0;
        auVar5._0_8_ = (Xvalues->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data[uVar4];
        auVar5 = vmovhpd_avx(auVar5,(Yvalues->
                                    super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).
                                    m_storage.m_data[uVar4]);
        auVar5 = vsubpd_avx(auVar5,*(undefined1 (*) [16])(this->Gc_g).m_data);
        adVar2 = (double  [2])vfmadd132pd_fma(auVar5,auVar6,*(undefined1 (*) [16])(this->Gz).m_data)
        ;
        if (uVar4 == 0) {
          local_68.m_data = adVar2;
          MoveTo(this,&local_68);
        }
        else {
          local_78.m_data = adVar2;
          AddLinePoint(this,&local_78);
        }
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
    ChStreamOutAscii::operator<<(this_00,"SK\n");
    ChStreamOutAscii::operator<<(this_00,"GR\n");
    return;
  }
  return;
}

Assistant:

void ChFile_ps::DrawGraphXY(const ChArray<>& Yvalues, const ChArray<>& Xvalues) {
    // Set clip region
    GrSave();
    ClipToGraph();

    int points = std::min((int)Xvalues.size(), (int)Yvalues.size());
    if (points == 0)
        return;

    StartLine();
    ChVector2<> mp;
    for (int i = 0; i < points; i++) {
        mp.x() = Xvalues(i);
        mp.y() = Yvalues(i);
        mp = To_page_from_graph(mp);
        if (i == 0)
            MoveTo(mp);
        else
            AddLinePoint(mp);
    }
    PaintStroke();

    GrRestore();
}